

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasn1element.cpp
# Opt level: O2

QByteArray * __thiscall
QAsn1Element::toObjectName(QByteArray *__return_storage_ptr__,QAsn1Element *this)

{
  int iVar1;
  const_iterator cVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_b8;
  QArrayDataPointer<char> local_98;
  QArrayDataPointer<char> local_80;
  QArrayDataPointer<char> local_68;
  QArrayDataPointer<char> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8.size = -0x5555555555555556;
  local_b8.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_b8.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  toObjectId((QByteArray *)&local_b8,this);
  if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::instance()::
      holder == '\0') {
    iVar1 = __cxa_guard_acquire(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>
                                 ::instance()::holder);
    if (iVar1 != 0) {
      QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::instance()::
      holder = 0;
      local_50.d = (Data *)0x0;
      local_68.d = (Data *)0x0;
      local_68.ptr = (char *)0x0;
      local_68.size = 0;
      local_50.ptr = "0.9.2342.19200300.100.1.5";
      local_50.size = 0x19;
      local_80.d = (Data *)0x0;
      local_98.d = (Data *)0x0;
      local_98.ptr = (char *)0x0;
      local_98.size = 0;
      local_80.ptr = "favouriteDrink";
      local_80.size = 0xe;
      QMap<QByteArray,_QByteArray>::insert
                ((QMap<QByteArray,_QByteArray> *)
                 &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
                  instance()::holder,(const_iterator)0x0,(QByteArray *)&local_50,
                 (QByteArray *)&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      cVar2._M_node =
           (_Base_ptr)
           (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
            instance()::holder + 0x10);
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::instance()
          ::holder == 0) {
        cVar2._M_node = (_Base_ptr)0x0;
      }
      local_50.d = (Data *)0x0;
      local_68.d = (Data *)0x0;
      local_68.ptr = (char *)0x0;
      local_50.ptr = "1.2.840.113549.1.9.1";
      local_68.size = 0;
      local_50.size = 0x14;
      local_80.d = (Data *)0x0;
      local_98.d = (Data *)0x0;
      local_98.ptr = (char *)0x0;
      local_98.size = 0;
      local_80.ptr = "emailAddress";
      local_80.size = 0xc;
      QMap<QByteArray,_QByteArray>::insert
                ((QMap<QByteArray,_QByteArray> *)
                 &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
                  instance()::holder,(const_iterator)cVar2._M_node,(QByteArray *)&local_50,
                 (QByteArray *)&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      cVar2._M_node =
           (_Base_ptr)
           (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
            instance()::holder + 0x10);
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::instance()
          ::holder == 0) {
        cVar2._M_node = (_Base_ptr)0x0;
      }
      local_68.d = (Data *)0x0;
      local_68.ptr = (char *)0x0;
      local_50.d = (Data *)0x0;
      local_68.size = 0;
      local_50.ptr = "1.3.6.1.5.5.7.1.1";
      local_80.d = (Data *)0x0;
      local_50.size = 0x11;
      local_98.d = (Data *)0x0;
      local_98.ptr = (char *)0x0;
      local_80.ptr = "authorityInfoAccess";
      local_98.size = 0;
      local_80.size = 0x13;
      QMap<QByteArray,_QByteArray>::insert
                ((QMap<QByteArray,_QByteArray> *)
                 &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
                  instance()::holder,(const_iterator)cVar2._M_node,(QByteArray *)&local_50,
                 (QByteArray *)&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      cVar2._M_node =
           (_Base_ptr)
           (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
            instance()::holder + 0x10);
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::instance()
          ::holder == 0) {
        cVar2._M_node = (_Base_ptr)0x0;
      }
      local_50.d = (Data *)0x0;
      local_68.d = (Data *)0x0;
      local_68.ptr = (char *)0x0;
      local_50.ptr = "1.3.6.1.5.5.7.48.1";
      local_68.size = 0;
      local_50.size = 0x12;
      local_80.d = (Data *)0x0;
      local_98.d = (Data *)0x0;
      local_98.ptr = (char *)0x0;
      local_98.size = 0;
      local_80.ptr = "OCSP";
      local_80.size = 4;
      QMap<QByteArray,_QByteArray>::insert
                ((QMap<QByteArray,_QByteArray> *)
                 &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
                  instance()::holder,(const_iterator)cVar2._M_node,(QByteArray *)&local_50,
                 (QByteArray *)&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      cVar2._M_node =
           (_Base_ptr)
           (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
            instance()::holder + 0x10);
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::instance()
          ::holder == 0) {
        cVar2._M_node = (_Base_ptr)0x0;
      }
      local_68.d = (Data *)0x0;
      local_68.ptr = (char *)0x0;
      local_50.d = (Data *)0x0;
      local_50.ptr = "1.3.6.1.5.5.7.48.2";
      local_68.size = 0;
      local_50.size = 0x12;
      local_80.d = (Data *)0x0;
      local_98.d = (Data *)0x0;
      local_98.ptr = (char *)0x0;
      local_98.size = 0;
      local_80.ptr = "caIssuers";
      local_80.size = 9;
      QMap<QByteArray,_QByteArray>::insert
                ((QMap<QByteArray,_QByteArray> *)
                 &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
                  instance()::holder,(const_iterator)cVar2._M_node,(QByteArray *)&local_50,
                 (QByteArray *)&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      cVar2._M_node =
           (_Base_ptr)
           (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
            instance()::holder + 0x10);
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::instance()
          ::holder == 0) {
        cVar2._M_node = (_Base_ptr)0x0;
      }
      local_68.d = (Data *)0x0;
      local_68.ptr = (char *)0x0;
      local_50.d = (Data *)0x0;
      local_68.size = 0;
      local_50.ptr = "2.5.29.14";
      local_80.d = (Data *)0x0;
      local_50.size = 9;
      local_98.d = (Data *)0x0;
      local_98.ptr = (char *)0x0;
      local_80.ptr = "subjectKeyIdentifier";
      local_98.size = 0;
      local_80.size = 0x14;
      QMap<QByteArray,_QByteArray>::insert
                ((QMap<QByteArray,_QByteArray> *)
                 &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
                  instance()::holder,(const_iterator)cVar2._M_node,(QByteArray *)&local_50,
                 (QByteArray *)&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      cVar2._M_node =
           (_Base_ptr)
           (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
            instance()::holder + 0x10);
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::instance()
          ::holder == 0) {
        cVar2._M_node = (_Base_ptr)0x0;
      }
      local_68.d = (Data *)0x0;
      local_68.ptr = (char *)0x0;
      local_50.d = (Data *)0x0;
      local_50.ptr = "2.5.29.15";
      local_68.size = 0;
      local_50.size = 9;
      local_80.d = (Data *)0x0;
      local_98.d = (Data *)0x0;
      local_98.ptr = (char *)0x0;
      local_98.size = 0;
      local_80.ptr = "keyUsage";
      local_80.size = 8;
      QMap<QByteArray,_QByteArray>::insert
                ((QMap<QByteArray,_QByteArray> *)
                 &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
                  instance()::holder,(const_iterator)cVar2._M_node,(QByteArray *)&local_50,
                 (QByteArray *)&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      cVar2._M_node =
           (_Base_ptr)
           (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
            instance()::holder + 0x10);
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::instance()
          ::holder == 0) {
        cVar2._M_node = (_Base_ptr)0x0;
      }
      local_68.d = (Data *)0x0;
      local_68.ptr = (char *)0x0;
      local_50.d = (Data *)0x0;
      local_68.size = 0;
      local_50.ptr = "2.5.29.17";
      local_80.d = (Data *)0x0;
      local_50.size = 9;
      local_98.d = (Data *)0x0;
      local_98.ptr = (char *)0x0;
      local_80.ptr = "subjectAltName";
      local_98.size = 0;
      local_80.size = 0xe;
      QMap<QByteArray,_QByteArray>::insert
                ((QMap<QByteArray,_QByteArray> *)
                 &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
                  instance()::holder,(const_iterator)cVar2._M_node,(QByteArray *)&local_50,
                 (QByteArray *)&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      cVar2._M_node =
           (_Base_ptr)
           (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
            instance()::holder + 0x10);
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::instance()
          ::holder == 0) {
        cVar2._M_node = (_Base_ptr)0x0;
      }
      local_68.d = (Data *)0x0;
      local_68.ptr = (char *)0x0;
      local_50.d = (Data *)0x0;
      local_68.size = 0;
      local_50.ptr = "2.5.29.19";
      local_80.d = (Data *)0x0;
      local_50.size = 9;
      local_98.d = (Data *)0x0;
      local_98.ptr = (char *)0x0;
      local_80.ptr = "basicConstraints";
      local_98.size = 0;
      local_80.size = 0x10;
      QMap<QByteArray,_QByteArray>::insert
                ((QMap<QByteArray,_QByteArray> *)
                 &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
                  instance()::holder,(const_iterator)cVar2._M_node,(QByteArray *)&local_50,
                 (QByteArray *)&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      cVar2._M_node =
           (_Base_ptr)
           (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
            instance()::holder + 0x10);
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::instance()
          ::holder == 0) {
        cVar2._M_node = (_Base_ptr)0x0;
      }
      local_68.d = (Data *)0x0;
      local_68.ptr = (char *)0x0;
      local_50.d = (Data *)0x0;
      local_68.size = 0;
      local_50.ptr = "2.5.29.35";
      local_80.d = (Data *)0x0;
      local_50.size = 9;
      local_98.d = (Data *)0x0;
      local_98.ptr = (char *)0x0;
      local_80.ptr = "authorityKeyIdentifier";
      local_98.size = 0;
      local_80.size = 0x16;
      QMap<QByteArray,_QByteArray>::insert
                ((QMap<QByteArray,_QByteArray> *)
                 &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
                  instance()::holder,(const_iterator)cVar2._M_node,(QByteArray *)&local_50,
                 (QByteArray *)&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      cVar2._M_node =
           (_Base_ptr)
           (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
            instance()::holder + 0x10);
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::instance()
          ::holder == 0) {
        cVar2._M_node = (_Base_ptr)0x0;
      }
      local_68.d = (Data *)0x0;
      local_68.ptr = (char *)0x0;
      local_50.d = (Data *)0x0;
      local_50.ptr = "2.5.4.10";
      local_68.size = 0;
      local_50.size = 8;
      local_80.d = (Data *)0x0;
      local_98.d = (Data *)0x0;
      local_98.ptr = (char *)0x0;
      local_98.size = 0;
      local_80.ptr = "O";
      local_80.size = 1;
      QMap<QByteArray,_QByteArray>::insert
                ((QMap<QByteArray,_QByteArray> *)
                 &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
                  instance()::holder,(const_iterator)cVar2._M_node,(QByteArray *)&local_50,
                 (QByteArray *)&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      cVar2._M_node =
           (_Base_ptr)
           (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
            instance()::holder + 0x10);
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::instance()
          ::holder == 0) {
        cVar2._M_node = (_Base_ptr)0x0;
      }
      local_68.d = (Data *)0x0;
      local_68.ptr = (char *)0x0;
      local_50.d = (Data *)0x0;
      local_50.ptr = "2.5.4.11";
      local_68.size = 0;
      local_50.size = 8;
      local_80.d = (Data *)0x0;
      local_98.d = (Data *)0x0;
      local_98.ptr = (char *)0x0;
      local_98.size = 0;
      local_80.ptr = "OU";
      local_80.size = 2;
      QMap<QByteArray,_QByteArray>::insert
                ((QMap<QByteArray,_QByteArray> *)
                 &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
                  instance()::holder,(const_iterator)cVar2._M_node,(QByteArray *)&local_50,
                 (QByteArray *)&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      cVar2._M_node =
           (_Base_ptr)
           (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
            instance()::holder + 0x10);
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::instance()
          ::holder == 0) {
        cVar2._M_node = (_Base_ptr)0x0;
      }
      local_68.d = (Data *)0x0;
      local_68.ptr = (char *)0x0;
      local_50.d = (Data *)0x0;
      local_68.size = 0;
      local_50.ptr = "2.5.4.12";
      local_80.d = (Data *)0x0;
      local_50.size = 8;
      local_98.d = (Data *)0x0;
      local_98.ptr = (char *)0x0;
      local_80.ptr = "title";
      local_98.size = 0;
      local_80.size = 5;
      QMap<QByteArray,_QByteArray>::insert
                ((QMap<QByteArray,_QByteArray> *)
                 &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
                  instance()::holder,(const_iterator)cVar2._M_node,(QByteArray *)&local_50,
                 (QByteArray *)&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      cVar2._M_node =
           (_Base_ptr)
           (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
            instance()::holder + 0x10);
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::instance()
          ::holder == 0) {
        cVar2._M_node = (_Base_ptr)0x0;
      }
      local_68.d = (Data *)0x0;
      local_68.ptr = (char *)0x0;
      local_50.d = (Data *)0x0;
      local_50.ptr = "2.5.4.13";
      local_68.size = 0;
      local_50.size = 8;
      local_80.d = (Data *)0x0;
      local_98.d = (Data *)0x0;
      local_98.ptr = (char *)0x0;
      local_98.size = 0;
      local_80.ptr = "description";
      local_80.size = 0xb;
      QMap<QByteArray,_QByteArray>::insert
                ((QMap<QByteArray,_QByteArray> *)
                 &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
                  instance()::holder,(const_iterator)cVar2._M_node,(QByteArray *)&local_50,
                 (QByteArray *)&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      cVar2._M_node =
           (_Base_ptr)
           (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
            instance()::holder + 0x10);
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::instance()
          ::holder == 0) {
        cVar2._M_node = (_Base_ptr)0x0;
      }
      local_68.d = (Data *)0x0;
      local_68.ptr = (char *)0x0;
      local_50.d = (Data *)0x0;
      local_68.size = 0;
      local_50.ptr = "2.5.4.17";
      local_80.d = (Data *)0x0;
      local_50.size = 8;
      local_98.d = (Data *)0x0;
      local_98.ptr = (char *)0x0;
      local_80.ptr = "postalCode";
      local_98.size = 0;
      local_80.size = 10;
      QMap<QByteArray,_QByteArray>::insert
                ((QMap<QByteArray,_QByteArray> *)
                 &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
                  instance()::holder,(const_iterator)cVar2._M_node,(QByteArray *)&local_50,
                 (QByteArray *)&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      cVar2._M_node =
           (_Base_ptr)
           (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
            instance()::holder + 0x10);
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::instance()
          ::holder == 0) {
        cVar2._M_node = (_Base_ptr)0x0;
      }
      local_50.d = (Data *)0x0;
      local_68.d = (Data *)0x0;
      local_68.ptr = (char *)0x0;
      local_68.size = 0;
      local_98.d = (Data *)0x0;
      local_80.d = (Data *)0x0;
      local_50.ptr = "2.5.4.3";
      local_98.ptr = (char *)0x0;
      local_50.size = 7;
      local_80.ptr = "CN";
      local_98.size = 0;
      local_80.size = 2;
      QMap<QByteArray,_QByteArray>::insert
                ((QMap<QByteArray,_QByteArray> *)
                 &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
                  instance()::holder,(const_iterator)cVar2._M_node,(QByteArray *)&local_50,
                 (QByteArray *)&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      cVar2._M_node =
           (_Base_ptr)
           (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
            instance()::holder + 0x10);
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::instance()
          ::holder == 0) {
        cVar2._M_node = (_Base_ptr)0x0;
      }
      local_68.d = (Data *)0x0;
      local_50.d = (Data *)0x0;
      local_68.ptr = (char *)0x0;
      local_68.size = 0;
      local_98.d = (Data *)0x0;
      local_80.d = (Data *)0x0;
      local_98.ptr = (char *)0x0;
      local_50.ptr = "2.5.4.4";
      local_50.size = 7;
      local_80.ptr = "SN";
      local_98.size = 0;
      local_80.size = 2;
      QMap<QByteArray,_QByteArray>::insert
                ((QMap<QByteArray,_QByteArray> *)
                 &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
                  instance()::holder,(const_iterator)cVar2._M_node,(QByteArray *)&local_50,
                 (QByteArray *)&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      cVar2._M_node =
           (_Base_ptr)
           (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
            instance()::holder + 0x10);
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::instance()
          ::holder == 0) {
        cVar2._M_node = (_Base_ptr)0x0;
      }
      local_68.d = (Data *)0x0;
      local_50.d = (Data *)0x0;
      local_68.ptr = (char *)0x0;
      local_68.size = 0;
      local_98.d = (Data *)0x0;
      local_80.d = (Data *)0x0;
      local_98.ptr = (char *)0x0;
      local_50.ptr = "2.5.4.41";
      local_50.size = 8;
      local_80.ptr = "name";
      local_98.size = 0;
      local_80.size = 4;
      QMap<QByteArray,_QByteArray>::insert
                ((QMap<QByteArray,_QByteArray> *)
                 &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
                  instance()::holder,(const_iterator)cVar2._M_node,(QByteArray *)&local_50,
                 (QByteArray *)&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      cVar2._M_node =
           (_Base_ptr)
           (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
            instance()::holder + 0x10);
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::instance()
          ::holder == 0) {
        cVar2._M_node = (_Base_ptr)0x0;
      }
      local_68.d = (Data *)0x0;
      local_50.d = (Data *)0x0;
      local_68.ptr = (char *)0x0;
      local_68.size = 0;
      local_98.d = (Data *)0x0;
      local_80.d = (Data *)0x0;
      local_98.ptr = (char *)0x0;
      local_50.ptr = "2.5.4.42";
      local_50.size = 8;
      local_80.ptr = "GN";
      local_98.size = 0;
      local_80.size = 2;
      QMap<QByteArray,_QByteArray>::insert
                ((QMap<QByteArray,_QByteArray> *)
                 &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
                  instance()::holder,(const_iterator)cVar2._M_node,(QByteArray *)&local_50,
                 (QByteArray *)&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      cVar2._M_node =
           (_Base_ptr)
           (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
            instance()::holder + 0x10);
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::instance()
          ::holder == 0) {
        cVar2._M_node = (_Base_ptr)0x0;
      }
      local_68.d = (Data *)0x0;
      local_50.d = (Data *)0x0;
      local_68.ptr = (char *)0x0;
      local_68.size = 0;
      local_98.d = (Data *)0x0;
      local_80.d = (Data *)0x0;
      local_98.ptr = (char *)0x0;
      local_50.ptr = "2.5.4.43";
      local_50.size = 8;
      local_80.ptr = "initials";
      local_98.size = 0;
      local_80.size = 8;
      QMap<QByteArray,_QByteArray>::insert
                ((QMap<QByteArray,_QByteArray> *)
                 &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
                  instance()::holder,(const_iterator)cVar2._M_node,(QByteArray *)&local_50,
                 (QByteArray *)&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      cVar2._M_node =
           (_Base_ptr)
           (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
            instance()::holder + 0x10);
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::instance()
          ::holder == 0) {
        cVar2._M_node = (_Base_ptr)0x0;
      }
      local_68.d = (Data *)0x0;
      local_50.d = (Data *)0x0;
      local_68.ptr = (char *)0x0;
      local_68.size = 0;
      local_98.d = (Data *)0x0;
      local_80.d = (Data *)0x0;
      local_98.ptr = (char *)0x0;
      local_50.ptr = "2.5.4.46";
      local_50.size = 8;
      local_80.ptr = "dnQualifier";
      local_98.size = 0;
      local_80.size = 0xb;
      QMap<QByteArray,_QByteArray>::insert
                ((QMap<QByteArray,_QByteArray> *)
                 &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
                  instance()::holder,(const_iterator)cVar2._M_node,(QByteArray *)&local_50,
                 (QByteArray *)&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      cVar2._M_node =
           (_Base_ptr)
           (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
            instance()::holder + 0x10);
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::instance()
          ::holder == 0) {
        cVar2._M_node = (_Base_ptr)0x0;
      }
      local_68.d = (Data *)0x0;
      local_50.d = (Data *)0x0;
      local_68.ptr = (char *)0x0;
      local_68.size = 0;
      local_98.d = (Data *)0x0;
      local_80.d = (Data *)0x0;
      local_98.ptr = (char *)0x0;
      local_50.ptr = "2.5.4.5";
      local_50.size = 7;
      local_80.ptr = "serialNumber";
      local_98.size = 0;
      local_80.size = 0xc;
      QMap<QByteArray,_QByteArray>::insert
                ((QMap<QByteArray,_QByteArray> *)
                 &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
                  instance()::holder,(const_iterator)cVar2._M_node,(QByteArray *)&local_50,
                 (QByteArray *)&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      cVar2._M_node =
           (_Base_ptr)
           (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
            instance()::holder + 0x10);
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::instance()
          ::holder == 0) {
        cVar2._M_node = (_Base_ptr)0x0;
      }
      local_68.d = (Data *)0x0;
      local_50.d = (Data *)0x0;
      local_68.ptr = (char *)0x0;
      local_68.size = 0;
      local_98.d = (Data *)0x0;
      local_80.d = (Data *)0x0;
      local_98.ptr = (char *)0x0;
      local_50.ptr = "2.5.4.6";
      local_50.size = 7;
      local_80.ptr = "C";
      local_98.size = 0;
      local_80.size = 1;
      QMap<QByteArray,_QByteArray>::insert
                ((QMap<QByteArray,_QByteArray> *)
                 &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
                  instance()::holder,(const_iterator)cVar2._M_node,(QByteArray *)&local_50,
                 (QByteArray *)&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      cVar2._M_node =
           (_Base_ptr)
           (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
            instance()::holder + 0x10);
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::instance()
          ::holder == 0) {
        cVar2._M_node = (_Base_ptr)0x0;
      }
      local_68.d = (Data *)0x0;
      local_50.d = (Data *)0x0;
      local_68.ptr = (char *)0x0;
      local_68.size = 0;
      local_98.d = (Data *)0x0;
      local_80.d = (Data *)0x0;
      local_98.ptr = (char *)0x0;
      local_50.ptr = "2.5.4.7";
      local_50.size = 7;
      local_80.ptr = "L";
      local_98.size = 0;
      local_80.size = 1;
      QMap<QByteArray,_QByteArray>::insert
                ((QMap<QByteArray,_QByteArray> *)
                 &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
                  instance()::holder,(const_iterator)cVar2._M_node,(QByteArray *)&local_50,
                 (QByteArray *)&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      cVar2._M_node =
           (_Base_ptr)
           (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
            instance()::holder + 0x10);
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::instance()
          ::holder == 0) {
        cVar2._M_node = (_Base_ptr)0x0;
      }
      local_68.d = (Data *)0x0;
      local_50.d = (Data *)0x0;
      local_68.ptr = (char *)0x0;
      local_68.size = 0;
      local_98.d = (Data *)0x0;
      local_80.d = (Data *)0x0;
      local_98.ptr = (char *)0x0;
      local_50.ptr = "2.5.4.8";
      local_50.size = 7;
      local_80.ptr = "ST";
      local_98.size = 0;
      local_80.size = 2;
      QMap<QByteArray,_QByteArray>::insert
                ((QMap<QByteArray,_QByteArray> *)
                 &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
                  instance()::holder,(const_iterator)cVar2._M_node,(QByteArray *)&local_50,
                 (QByteArray *)&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      cVar2._M_node =
           (_Base_ptr)
           (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
            instance()::holder + 0x10);
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::instance()
          ::holder == 0) {
        cVar2._M_node = (_Base_ptr)0x0;
      }
      local_68.d = (Data *)0x0;
      local_50.d = (Data *)0x0;
      local_68.ptr = (char *)0x0;
      local_68.size = 0;
      local_98.d = (Data *)0x0;
      local_80.d = (Data *)0x0;
      local_98.ptr = (char *)0x0;
      local_50.ptr = "2.5.4.9";
      local_50.size = 7;
      local_80.ptr = "street";
      local_98.size = 0;
      local_80.size = 6;
      QMap<QByteArray,_QByteArray>::insert
                ((QMap<QByteArray,_QByteArray> *)
                 &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
                  instance()::holder,(const_iterator)cVar2._M_node,(QByteArray *)&local_50,
                 (QByteArray *)&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      __cxa_atexit(QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>::~Holder,
                   &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
                    instance()::holder,&__dso_handle);
      __cxa_guard_release(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>
                           ::instance()::holder);
    }
  }
  QMap<QByteArray,_QByteArray>::value
            (__return_storage_ptr__,
             (QMap<QByteArray,_QByteArray> *)
             &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_oidNameMap>>::
              instance()::holder,(QByteArray *)&local_b8,(QByteArray *)&local_b8);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QAsn1Element::toObjectName() const
{
    QByteArray key = toObjectId();
    return oidNameMap->value(key, key);
}